

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_errno(lua_State *L)

{
  int iVar1;
  double *pdVar2;
  int32_t iVar3;
  int *piVar4;
  long in_RDI;
  int err;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  if (*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) {
    iVar3 = ffi_checkint((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                         (int)((ulong)in_RDI >> 0x20));
    piVar4 = __errno_location();
    *piVar4 = iVar3;
  }
  pdVar2 = *(double **)(in_RDI + 0x18);
  *(double **)(in_RDI + 0x18) = pdVar2 + 1;
  *pdVar2 = (double)iVar1;
  return 1;
}

Assistant:

LJLIB_CF(ffi_errno)	LJLIB_REC(.)
{
  int err = errno;
  if (L->top > L->base)
    errno = ffi_checkint(L, 1);
  setintV(L->top++, err);
  return 1;
}